

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O3

int lj_cf_os_setlocale(lua_State *L)

{
  int __category;
  GCstr *pGVar1;
  char *str;
  GCstr *__locale;
  
  if ((L->base < L->top) && ((L->base->field_2).it != 0xffffffff)) {
    pGVar1 = lj_lib_checkstr(L,1);
  }
  else {
    pGVar1 = (GCstr *)0x0;
  }
  __category = lj_lib_checkopt(L,2,6,anon_var_dwarf_2134);
  __locale = pGVar1 + 1;
  if (pGVar1 == (GCstr *)0x0) {
    __locale = (GCstr *)0x0;
  }
  str = setlocale(__category,(char *)__locale);
  lua_pushstring(L,str);
  return 1;
}

Assistant:

LJLIB_CF(os_setlocale)
{
#if LJ_TARGET_PSVITA
  lua_pushliteral(L, "C");
#else
  GCstr *s = lj_lib_optstr(L, 1);
  const char *str = s ? strdata(s) : NULL;
  int opt = lj_lib_checkopt(L, 2, 6,
    "\5ctype\7numeric\4time\7collate\10monetary\1\377\3all");
  if (opt == 0) opt = LC_CTYPE;
  else if (opt == 1) opt = LC_NUMERIC;
  else if (opt == 2) opt = LC_TIME;
  else if (opt == 3) opt = LC_COLLATE;
  else if (opt == 4) opt = LC_MONETARY;
  else if (opt == 6) opt = LC_ALL;
  lua_pushstring(L, setlocale(opt, str));
#endif
  return 1;
}